

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument_p.cpp
# Opt level: O0

void __thiscall
QTextDocumentPrivate::clearUndoRedoStacks
          (QTextDocumentPrivate *this,Stacks stacksToClear,bool emitSignals)

{
  int iVar1;
  long lVar2;
  byte bVar3;
  bool bVar4;
  qsizetype qVar5;
  const_reference pQVar6;
  long lVar7;
  byte in_DL;
  int in_ESI;
  long in_RDI;
  long in_FS_OFFSET;
  bool bVar8;
  bool bVar9;
  int i_2;
  int i_1;
  int i;
  bool redoCommandsAvailable;
  bool undoCommandsAvailable;
  QTextUndoCommand c_2;
  QTextUndoCommand c_1;
  QTextUndoCommand c;
  qsizetype in_stack_ffffffffffffff38;
  QList<QTextUndoCommand> *in_stack_ffffffffffffff40;
  QList<QTextUndoCommand> *pQVar10;
  qsizetype in_stack_ffffffffffffff48;
  undefined1 uVar11;
  QTextDocumentPrivate *in_stack_ffffffffffffff50;
  QTextDocumentPrivate *pQVar12;
  int local_84;
  int local_80;
  int local_7c;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  bVar3 = in_DL & 1;
  bVar8 = *(int *)(in_RDI + 0xbc) != 0;
  iVar1 = *(int *)(in_RDI + 0xbc);
  qVar5 = QList<QTextUndoCommand>::size((QList<QTextUndoCommand> *)(in_RDI + 0xa0));
  bVar9 = iVar1 != qVar5;
  if ((in_ESI == 1) && (bVar8)) {
    for (local_7c = 0; uVar11 = (undefined1)((ulong)in_stack_ffffffffffffff48 >> 0x38),
        local_7c < *(int *)(in_RDI + 0xbc); local_7c = local_7c + 1) {
      pQVar6 = QList<QTextUndoCommand>::at(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      if ((((undefined1  [32])*pQVar6 & (undefined1  [32])0x100) != (undefined1  [32])0x0) &&
         ((pQVar6->field_8).custom != (QAbstractUndoItem *)0x0)) {
        (*((pQVar6->field_8).custom)->_vptr_QAbstractUndoItem[1])();
      }
    }
    QList<QTextUndoCommand>::remove((QList<QTextUndoCommand> *)(in_RDI + 0xa0),(char *)0x0);
    *(undefined4 *)(in_RDI + 0xbc) = 0;
    if (bVar3 != 0) {
      emitUndoAvailable(in_stack_ffffffffffffff50,(bool)uVar11);
    }
  }
  else if ((in_ESI == 2) && (bVar9)) {
    for (local_80 = *(int *)(in_RDI + 0xbc);
        qVar5 = QList<QTextUndoCommand>::size((QList<QTextUndoCommand> *)(in_RDI + 0xa0)),
        local_80 < qVar5; local_80 = local_80 + 1) {
      pQVar6 = QList<QTextUndoCommand>::at(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      pQVar12 = (QTextDocumentPrivate *)(pQVar6->field_8).custom;
      if ((((undefined1  [32])*pQVar6 & (undefined1  [32])0x100) != (undefined1  [32])0x0) &&
         (in_stack_ffffffffffffff50 = pQVar12, pQVar12 != (QTextDocumentPrivate *)0x0)) {
        (*(*(_func_int ***)pQVar12)[1])();
        in_stack_ffffffffffffff50 = pQVar12;
      }
    }
    QList<QTextUndoCommand>::resize
              ((QList<QTextUndoCommand> *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    if (bVar3 != 0) {
      emitRedoAvailable(in_stack_ffffffffffffff50,SUB81((ulong)in_stack_ffffffffffffff48 >> 0x38,0))
      ;
    }
  }
  else if ((in_ESI == 3) &&
          (bVar4 = QList<QTextUndoCommand>::isEmpty((QList<QTextUndoCommand> *)0x7d1016), !bVar4)) {
    local_84 = 0;
    while( true ) {
      lVar7 = (long)local_84;
      qVar5 = QList<QTextUndoCommand>::size((QList<QTextUndoCommand> *)(in_RDI + 0xa0));
      if (qVar5 <= lVar7) break;
      pQVar6 = QList<QTextUndoCommand>::at(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
      pQVar10 = (QList<QTextUndoCommand> *)(pQVar6->field_8).custom;
      if ((((undefined1  [32])*pQVar6 & (undefined1  [32])0x100) != (undefined1  [32])0x0) &&
         (in_stack_ffffffffffffff40 = pQVar10, pQVar10 != (QList<QTextUndoCommand> *)0x0)) {
        (*(code *)(((pQVar10->d).d)->super_QArrayData).alloc)();
        in_stack_ffffffffffffff40 = pQVar10;
      }
      local_84 = local_84 + 1;
    }
    *(undefined4 *)(in_RDI + 0xbc) = 0;
    QList<QTextUndoCommand>::clear(in_stack_ffffffffffffff40);
    uVar11 = (undefined1)((ulong)lVar7 >> 0x38);
    if ((bVar3 != 0) && (bVar8)) {
      emitUndoAvailable(in_stack_ffffffffffffff50,(bool)uVar11);
    }
    if ((bVar3 != 0) && (bVar9)) {
      emitRedoAvailable(in_stack_ffffffffffffff50,(bool)uVar11);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentPrivate::clearUndoRedoStacks(QTextDocument::Stacks stacksToClear,
                                               bool emitSignals)
{
    bool undoCommandsAvailable = undoState != 0;
    bool redoCommandsAvailable = undoState != undoStack.size();
    if (stacksToClear == QTextDocument::UndoStack && undoCommandsAvailable) {
        for (int i = 0; i < undoState; ++i) {
            QTextUndoCommand c = undoStack.at(i);
            if (c.command & QTextUndoCommand::Custom)
                delete c.custom;
        }
        undoStack.remove(0, undoState);
        undoState = 0;
        if (emitSignals)
            emitUndoAvailable(false);
    } else if (stacksToClear == QTextDocument::RedoStack
               && redoCommandsAvailable) {
        for (int i = undoState; i < undoStack.size(); ++i) {
            QTextUndoCommand c = undoStack.at(i);
            if (c.command & QTextUndoCommand::Custom)
                delete c.custom;
        }
        undoStack.resize(undoState);
        if (emitSignals)
            emitRedoAvailable(false);
    } else if (stacksToClear == QTextDocument::UndoAndRedoStacks
               && !undoStack.isEmpty()) {
        for (int i = 0; i < undoStack.size(); ++i) {
            QTextUndoCommand c = undoStack.at(i);
            if (c.command & QTextUndoCommand::Custom)
                delete c.custom;
        }
        undoState = 0;
        undoStack.clear();
        if (emitSignals && undoCommandsAvailable)
            emitUndoAvailable(false);
        if (emitSignals && redoCommandsAvailable)
            emitRedoAvailable(false);
    }
}